

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseInstance::Initialize
          (DatabaseInstance *this,char *database_path,DBConfig *user_config)

{
  unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true> *this_00;
  unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true> *this_01;
  string *db_type;
  _Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false> _Var1;
  undefined8 uVar2;
  LogManager *this_02;
  pointer this_03;
  type fs;
  pointer pDVar3;
  type fs_00;
  pointer pTVar4;
  InternalException *this_04;
  undefined1 local_770 [16];
  __native_type local_760 [3];
  DBConfig default_config;
  
  DBConfig::DBConfig(&default_config);
  if (user_config == (DBConfig *)0x0) {
    user_config = &default_config;
  }
  Configure(this,user_config,database_path);
  this->create_api_v1 = CreateAPIv1Wrapper;
  make_uniq<duckdb::DatabaseFileSystem,duckdb::DatabaseInstance&>((duckdb *)local_760,this);
  uVar2 = local_760[0].__align;
  local_760[0].__align = (pointer)0x0;
  _Var1._M_head_impl =
       (this->db_file_system).
       super_unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DatabaseFileSystem_*,_std::default_delete<duckdb::DatabaseFileSystem>_>
       .super__Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false>._M_head_impl;
  (this->db_file_system).
  super_unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DatabaseFileSystem_*,_std::default_delete<duckdb::DatabaseFileSystem>_>
  .super__Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false>._M_head_impl =
       (DatabaseFileSystem *)uVar2;
  if (_Var1._M_head_impl != (DatabaseFileSystem *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_OpenerFileSystem + 8))();
    if ((DatabaseManager *)local_760[0]._0_8_ != (DatabaseManager *)0x0) {
      (**(code **)(*(long *)local_760[0]._0_8_ + 8))();
    }
  }
  make_uniq<duckdb::DatabaseManager,duckdb::DatabaseInstance&>((duckdb *)local_760,this);
  uVar2 = local_760[0].__align;
  this_00 = &this->db_manager;
  local_760[0].__align =
       (__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>::
  reset((__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_> *)
        this_00,(pointer)uVar2);
  ::std::unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>::
  ~unique_ptr((unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_> *)
              local_760);
  if ((this->config).buffer_manager.internal.
      super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    make_uniq<duckdb::StandardBufferManager,duckdb::DatabaseInstance&,std::__cxx11::string&>
              ((duckdb *)local_760,this,&(this->config).options.temporary_directory);
    shared_ptr<duckdb::BufferManager,_true>::
    operator=<duckdb::StandardBufferManager,_std::default_delete<duckdb::StandardBufferManager>,_true,_0>
              (&this->buffer_manager,
               (unique_ptr<duckdb::StandardBufferManager,_std::default_delete<duckdb::StandardBufferManager>,_true>
                *)local_760);
    if ((DatabaseManager *)local_760[0]._0_8_ != (DatabaseManager *)0x0) {
      (**(code **)(*(long *)local_760[0]._0_8_ + 8))();
    }
  }
  else {
    shared_ptr<duckdb::BufferManager,_true>::operator=
              (&this->buffer_manager,&(this->config).buffer_manager);
  }
  LogConfig::LogConfig((LogConfig *)local_760);
  make_shared_ptr<duckdb::LogManager,duckdb::DatabaseInstance&,duckdb::LogConfig>
            ((DatabaseInstance *)local_770,(LogConfig *)this);
  shared_ptr<duckdb::LogManager,_true>::operator=
            (&this->log_manager,(shared_ptr<duckdb::LogManager,_true> *)local_770);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_770 + 8));
  LogConfig::~LogConfig((LogConfig *)local_760);
  this_02 = shared_ptr<duckdb::LogManager,_true>::operator->(&this->log_manager);
  LogManager::Initialize(this_02);
  make_uniq<duckdb::ExternalFileCache,duckdb::DatabaseInstance&,bool&>
            ((duckdb *)local_760,this,&(this->config).options.enable_external_file_cache);
  uVar2 = local_760[0].__align;
  local_760[0].__align =
       (__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>
  ::reset((__uniq_ptr_impl<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>
           *)&this->external_file_cache,(pointer)uVar2);
  ::std::unique_ptr<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>::
  ~unique_ptr((unique_ptr<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>
               *)local_760);
  make_uniq<duckdb::TaskScheduler,duckdb::DatabaseInstance&>((duckdb *)local_760,this);
  uVar2 = local_760[0].__align;
  this_01 = &this->scheduler;
  local_760[0].__align =
       (__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::reset
            ((__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             this_01,(pointer)uVar2);
  ::std::unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::~unique_ptr
            ((unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             local_760);
  make_uniq<duckdb::ObjectCache>();
  uVar2 = local_760[0].__align;
  local_760[0].__align =
       (__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_>::reset
            ((__uniq_ptr_impl<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_> *)
             &this->object_cache,(pointer)uVar2);
  ::std::unique_ptr<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_>::~unique_ptr
            ((unique_ptr<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_> *)local_760
            );
  make_uniq<duckdb::ConnectionManager>();
  uVar2 = local_760[0].__align;
  local_760[0].__align =
       (__uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>
  ::reset((__uniq_ptr_impl<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>
           *)&this->connection_manager,(pointer)uVar2);
  ::std::unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>::
  ~unique_ptr((unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>
               *)local_760);
  this_03 = unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>,_true>::
            operator->(&(this->config).secret_manager);
  SecretManager::Initialize(this_03,this);
  fs = unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>
       ::operator*(&this->db_file_system);
  db_type = &(this->config).options.database_type;
  DBPathAndType::ResolveDatabaseType((FileSystem *)fs,&(this->config).options.database_path,db_type)
  ;
  pDVar3 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>::
           operator->(this_00);
  DatabaseManager::InitializeSystemCatalog(pDVar3);
  if ((this->config).options.database_type._M_string_length != 0) {
    if ((this->config).file_system.
        super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl == (FileSystem *)0x0) {
      this_04 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)local_760,"No file system!?",(allocator *)local_770);
      InternalException::InternalException(this_04,(string *)local_760);
      __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    fs_00 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                      (&(this->config).file_system);
    ExtensionHelper::LoadExternalExtension(this,fs_00,db_type);
  }
  LoadExtensionSettings(this);
  pDVar3 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>::
           operator->(this_00);
  if ((pDVar3->default_database)._M_string_length == 0) {
    CreateMainDatabase(this);
  }
  pTVar4 = unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>::
           operator->(this_01);
  TaskScheduler::SetThreads
            (pTVar4,(this->config).options.maximum_threads,(this->config).options.external_threads);
  pTVar4 = unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>::
           operator->(this_01);
  TaskScheduler::RelaunchThreads(pTVar4);
  DBConfig::~DBConfig(&default_config);
  return;
}

Assistant:

void DatabaseInstance::Initialize(const char *database_path, DBConfig *user_config) {
	DBConfig default_config;
	DBConfig *config_ptr = &default_config;
	if (user_config) {
		config_ptr = user_config;
	}

	Configure(*config_ptr, database_path);

	create_api_v1 = CreateAPIv1Wrapper;

	db_file_system = make_uniq<DatabaseFileSystem>(*this);
	db_manager = make_uniq<DatabaseManager>(*this);
	if (config.buffer_manager) {
		buffer_manager = config.buffer_manager;
	} else {
		buffer_manager = make_uniq<StandardBufferManager>(*this, config.options.temporary_directory);
	}

	log_manager = make_shared_ptr<LogManager>(*this, LogConfig());
	log_manager->Initialize();

	external_file_cache = make_uniq<ExternalFileCache>(*this, config.options.enable_external_file_cache);

	scheduler = make_uniq<TaskScheduler>(*this);
	object_cache = make_uniq<ObjectCache>();
	connection_manager = make_uniq<ConnectionManager>();

	// initialize the secret manager
	config.secret_manager->Initialize(*this);

	// resolve the type of teh database we are opening
	auto &fs = FileSystem::GetFileSystem(*this);
	DBPathAndType::ResolveDatabaseType(fs, config.options.database_path, config.options.database_type);

	// initialize the system catalog
	db_manager->InitializeSystemCatalog();

	if (!config.options.database_type.empty()) {
		// if we are opening an extension database - load the extension
		if (!config.file_system) {
			throw InternalException("No file system!?");
		}
		ExtensionHelper::LoadExternalExtension(*this, *config.file_system, config.options.database_type);
	}

	LoadExtensionSettings();

	if (!db_manager->HasDefaultDatabase()) {
		CreateMainDatabase();
	}

	// only increase thread count after storage init because we get races on catalog otherwise
	scheduler->SetThreads(config.options.maximum_threads, config.options.external_threads);
	scheduler->RelaunchThreads();
}